

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

string * __thiscall
dap::BasicTypeInfo<dap::StackTraceResponse>::name_abi_cxx11_
          (string *__return_storage_ptr__,BasicTypeInfo<dap::StackTraceResponse> *this)

{
  BasicTypeInfo<dap::StackTraceResponse> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }